

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O3

_Bool COSE_Recipient_AddRecipient(HCOSE_RECIPIENT hEnc,HCOSE_RECIPIENT hRecip,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  cn_cbor *cb_value;
  COSE_RecipientInfo *p;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_28;
  
  if ((((hEnc == (HCOSE_RECIPIENT)0x0) ||
       (local_28 = in_RAX, _Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hEnc), !_Var1)) ||
      (hRecip == (HCOSE_RECIPIENT)0x0)) ||
     (_Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hRecip), !_Var1)) {
    if (perr == (cose_errback *)0x0) {
      return false;
    }
    perr->err = COSE_ERR_INVALID_HANDLE;
    return false;
  }
  *(undefined8 *)(hRecip + 0x70) = *(undefined8 *)(hEnc + 0x68);
  *(HCOSE_RECIPIENT *)(hEnc + 0x68) = hRecip;
  cb_value = _COSE_arrayget_int((COSE *)hEnc,3);
  if (cb_value == (cn_cbor *)0x0) {
    cb_value = cn_cbor_array_create(&local_28);
    if (cb_value == (cn_cbor *)0x0) goto LAB_0020185a;
    _Var1 = _COSE_array_replace((COSE *)hEnc,cb_value,3,&local_28);
    if (!_Var1) {
      cn_cbor_free(cb_value);
      goto LAB_0020185a;
    }
  }
  _Var1 = cn_cbor_array_append(cb_value,*(cn_cbor **)(hRecip + 0x18),&local_28);
  if (_Var1) {
    *(int *)(hRecip + 0x10) = *(int *)(hRecip + 0x10) + 1;
    return true;
  }
LAB_0020185a:
  if (perr != (cose_errback *)0x0) {
    cVar2 = _MapFromCBOR(local_28);
    perr->err = cVar2;
  }
  return false;
}

Assistant:

bool COSE_Recipient_AddRecipient(HCOSE_RECIPIENT hEnc, HCOSE_RECIPIENT hRecip, cose_errback * perr)
{
	COSE_RecipientInfo * pRecip;
	COSE_Enveloped * pEncrypt;
	cn_cbor * pRecipients = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context;
#endif
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidRecipientHandle(hEnc), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(IsValidRecipientHandle(hRecip), COSE_ERR_INVALID_HANDLE);

	pEncrypt = &((COSE_RecipientInfo *)hEnc)->m_encrypt;
	pRecip = (COSE_RecipientInfo *)hRecip;

#ifdef USE_CBOR_CONTEXT
	context = &pEncrypt->m_message.m_allocContext;
#endif // USE_CBOR_CONTEXT

	pRecip->m_recipientNext = pEncrypt->m_recipientFirst;
	pEncrypt->m_recipientFirst = pRecip;

	pRecipients = _COSE_arrayget_int(&pEncrypt->m_message, INDEX_RECIPIENTS);
	if (pRecipients == NULL) {
		pRecipients = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(pRecipients != NULL, cbor_error);

		if (!_COSE_array_replace(&pEncrypt->m_message, pRecipients, INDEX_RECIPIENTS, CBOR_CONTEXT_PARAM_COMMA &cbor_error)) {
			CN_CBOR_FREE(pRecipients, context);
			if (perr != NULL) perr->err = _MapFromCBOR(cbor_error);
			goto errorReturn;
		}
	}

	CHECK_CONDITION_CBOR(cn_cbor_array_append(pRecipients, pRecip->m_encrypt.m_message.m_cbor, &cbor_error), cbor_error);

	pRecip->m_encrypt.m_message.m_refCount++;

	return true;

errorReturn:
	return false;
}